

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall psy::C::Lexer::lexCharacterConstant(Lexer *this,SyntaxToken *tk,uchar prefix)

{
  SyntaxKind SVar1;
  uint accLeng;
  int iVar2;
  undefined7 in_register_00000011;
  
  accLeng = 1;
  iVar2 = (int)CONCAT71(in_register_00000011,prefix);
  if (iVar2 == 0x4c) {
    SVar1 = CharacterConstant_L_Token;
  }
  else if (iVar2 == 0x75) {
    SVar1 = CharacterConstant_u_Token;
  }
  else if (iVar2 == 0x55) {
    SVar1 = CharacterConstant_U_Token;
  }
  else {
    accLeng = 0;
    SVar1 = CharacterConstantToken;
  }
  tk->syntaxK_ = SVar1;
  lexUntilQuote(this,tk,'\'',accLeng);
  return;
}

Assistant:

void Lexer::lexCharacterConstant(SyntaxToken* tk, unsigned char prefix)
{
    unsigned int prefixSize = 1;
    if (prefix == 'L')
        tk->syntaxK_ = SyntaxKind::CharacterConstant_L_Token;
    else if (prefix == 'U')
        tk->syntaxK_ = SyntaxKind::CharacterConstant_U_Token;
    else if (prefix == 'u')
        tk->syntaxK_ = SyntaxKind::CharacterConstant_u_Token;
    else {
        tk->syntaxK_ = SyntaxKind::CharacterConstantToken;
        prefixSize = 0;
    }

    lexUntilQuote(tk, '\'', prefixSize);
}